

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddQuad(ImDrawList *this,ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *d,ImU32 col,
                   float thickness)

{
  ImDrawList *in_RCX;
  ImVec2 *in_RDI;
  undefined8 in_R8;
  float in_R9D;
  undefined4 in_XMM0_Da;
  
  if (((uint)in_R9D & 0xff000000) != 0) {
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathLineTo((ImDrawList *)CONCAT44(in_R9D,in_XMM0_Da),in_RDI);
    PathStroke(in_RCX,(ImU32)((ulong)in_R8 >> 0x20),SUB81((ulong)in_R8 >> 0x18,0),in_R9D);
  }
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}